

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

int32_t parse_symbol_bfr(Btor2Parser *bfr)

{
  int32_t iVar1;
  int32_t iVar2;
  Btor2Parser *in_RDI;
  int32_t ch;
  undefined4 in_stack_ffffffffffffffe8;
  int32_t local_4;
  
  in_RDI->nbuf = 0;
  do {
    iVar1 = getc_bfr(in_RDI);
    if (iVar1 == 10) {
LAB_0010839c:
      if (in_RDI->nbuf == 0) {
        in_RDI->lineno = in_RDI->lineno + -1;
        local_4 = perr_bfr(in_RDI,"empty symbol");
      }
      else {
        pushc_bfr(in_RDI,iVar1);
        local_4 = 1;
      }
      return local_4;
    }
    if (iVar1 == -1) {
      iVar1 = perr_bfr(in_RDI,"unexpected end-of-file in symbol");
      return iVar1;
    }
    if ((iVar1 == 0x20) || (iVar1 == 9)) {
      iVar1 = getc_bfr(in_RDI);
      if (iVar1 != 0x3b) {
        iVar1 = perr_bfr(in_RDI,"unexpected white-space in symbol");
        return iVar1;
      }
      iVar2 = skip_comment((Btor2Parser *)CONCAT44(0x3b,in_stack_ffffffffffffffe8));
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0010839c;
    }
    pushc_bfr(in_RDI,iVar1);
  } while( true );
}

Assistant:

static int32_t
parse_symbol_bfr (Btor2Parser *bfr)
{
  int32_t ch;
  bfr->nbuf = 0;
  while ((ch = getc_bfr (bfr)) != '\n')
  {
    if (ch == EOF)
      return perr_bfr (bfr, "unexpected end-of-file in symbol");
    else if (ch == ' ' || ch == '\t')
    {
      ch = getc_bfr (bfr);
      if (ch == ';')
      {
        if (!skip_comment (bfr)) return 0;
        break;
      }
      else
        return perr_bfr (bfr, "unexpected white-space in symbol");
    }
    pushc_bfr (bfr, ch);
  }
  if (!bfr->nbuf)
  {
    assert (bfr->lineno > 1);
    bfr->lineno--;
    return perr_bfr (bfr, "empty symbol");
  }
  pushc_bfr (bfr, 0);
  return 1;
}